

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# formatter.cpp
# Opt level: O0

string_type * __thiscall
booster::locale::impl_icu::number_format<char>::format_abi_cxx11_
          (number_format<char> *this,int32_t value,size_t *code_points)

{
  int iVar1;
  long *in_RCX;
  uint in_EDX;
  long in_RSI;
  string_type *in_RDI;
  UnicodeString tmp;
  UnicodeString *in_stack_ffffffffffffffa0;
  icu_std_converter<char,_1> *in_stack_ffffffffffffffa8;
  
  icu_70::UnicodeString::UnicodeString((UnicodeString *)in_RDI);
  icu_70::NumberFormat::format((int)*(undefined8 *)(in_RSI + 0x38),(UnicodeString *)(ulong)in_EDX);
  iVar1 = icu_70::UnicodeString::countChar32((int)&stack0xffffffffffffffa0,0);
  *in_RCX = (long)iVar1;
  icu_std_converter<char,1>::std_abi_cxx11_(in_stack_ffffffffffffffa8,in_stack_ffffffffffffffa0);
  icu_70::UnicodeString::~UnicodeString((UnicodeString *)&stack0xffffffffffffffa0);
  return in_RDI;
}

Assistant:

virtual string_type format(int32_t value,size_t &code_points) const
            {
                icu::UnicodeString tmp;
                #ifdef __SUNPRO_CC 
                icu_fmt_->format(static_cast<int>(value),tmp);
                #else
                icu_fmt_->format(::int32_t(value),tmp);
                #endif
                code_points=tmp.countChar32();
                return cvt_.std(tmp);
            }